

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH4Factory::BVH4Triangle4i
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  int iVar1;
  BVHN<4> *pBVar2;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  bool bVar7;
  size_t sVar8;
  Intersectors intersectors;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  BVHN<4> *local_268;
  long lStack_260;
  _func_int **local_258;
  atomic<unsigned_long> aStack_250;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_248;
  undefined1 local_230 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_228;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_218 [3];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  size_type local_1d0;
  size_type local_188;
  Intersectors local_148;
  
  pBVar2 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(pBVar2,(PrimitiveType *)&TriangleMi<4>::type,scene);
  local_148.intersector1.intersect = (IntersectFunc)0x0;
  local_148.intersector1.occluded = (OccludedFunc)0x0;
  local_148.collider.collide = (CollideFunc)0x0;
  local_148.collider.name = (char *)0x0;
  local_148.ptr = (AccelData *)0x0;
  local_148.leafIntersector = (__pointer_type)0x0;
  memset(&local_148.intersector1.name,0,0xe0);
  iVar1 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x50));
  if (iVar1 == 0) {
    BVH4Triangle4iIntersectors(&local_148,this,pBVar2,ivariant);
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x50));
    if (iVar1 == 0) {
      local_248._0_8_ = 0;
      local_248._8_8_ = 0;
      local_258 = (_func_int **)0x0;
      aStack_250.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      local_268 = (BVHN<4> *)0x0;
      lStack_260 = 0;
      memset(local_230,0,0xe0);
      local_268 = pBVar2;
      (*this->BVH4Triangle4iIntersector1Moeller)((Intersector1 *)&local_248.field_1);
      (*this->BVH4Triangle4iIntersector4HybridMoeller)((Intersector4 *)local_288);
      local_218[0]._0_8_ = local_278._M_allocated_capacity;
      local_228.m128[0] = (float)local_288._0_4_;
      local_228.m128[1] = (float)local_288._4_4_;
      local_228.m128[2] = fStack_280;
      local_228.m128[3] = fStack_27c;
      (*this->BVH4Triangle4iIntersector8HybridMoeller)((Intersector8 *)local_288);
      local_1d0 = local_278._M_allocated_capacity;
      local_1e0 = (float)local_288._0_4_;
      fStack_1dc = (float)local_288._4_4_;
      fStack_1d8 = fStack_280;
      fStack_1d4 = fStack_27c;
      (*this->BVH4Triangle4iIntersector16HybridMoeller)((Intersector16 *)local_288);
    }
    else {
      iVar1 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x50));
      if (iVar1 != 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,"unknown traverser ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x50));
        plVar6 = (long *)std::__cxx11::string::append(local_288);
        local_268 = (BVHN<4> *)*plVar6;
        pBVar2 = (BVHN<4> *)(plVar6 + 2);
        if (local_268 == pBVar2) {
          local_258 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
          aStack_250.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)plVar6[3];
          local_268 = (BVHN<4> *)&local_258;
        }
        else {
          local_258 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
        }
        lStack_260 = plVar6[1];
        *plVar6 = (long)pBVar2;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        *puVar5 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar5 + 1) = 2;
        puVar5[2] = puVar5 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 2),local_268,
                   (long)&(local_268->super_AccelData).super_RefCount._vptr_RefCount + lStack_260);
        __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      local_248._0_8_ = 0;
      local_248._8_8_ = 0;
      local_258 = (_func_int **)0x0;
      aStack_250.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      local_268 = (BVHN<4> *)0x0;
      lStack_260 = 0;
      memset(local_230,0,0xe0);
      local_268 = pBVar2;
      (*this->BVH4Triangle4iIntersector1Pluecker)((Intersector1 *)&local_248.field_1);
      (*this->BVH4Triangle4iIntersector4HybridPluecker)((Intersector4 *)local_288);
      local_218[0]._0_8_ = local_278._M_allocated_capacity;
      local_228.m128[0] = (float)local_288._0_4_;
      local_228.m128[1] = (float)local_288._4_4_;
      local_228.m128[2] = fStack_280;
      local_228.m128[3] = fStack_27c;
      (*this->BVH4Triangle4iIntersector8HybridPluecker)((Intersector8 *)local_288);
      local_1d0 = local_278._M_allocated_capacity;
      local_1e0 = (float)local_288._0_4_;
      fStack_1dc = (float)local_288._4_4_;
      fStack_1d8 = fStack_280;
      fStack_1d4 = fStack_27c;
      (*this->BVH4Triangle4iIntersector16HybridPluecker)((Intersector16 *)local_288);
    }
    local_188 = local_278._M_allocated_capacity;
    memcpy(&local_148,&local_268,0x118);
  }
  iVar1 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
  if (iVar1 == 0) {
    if (bvariant == HIGH_QUALITY) {
LAB_00c7479c:
      pBVar3 = (*this->BVH4Triangle4iSceneBuilderFastSpatialSAH)(pBVar2,scene,0);
      goto LAB_00c747d8;
    }
    if (bvariant == DYNAMIC) {
LAB_00c747ad:
      bVar7 = false;
LAB_00c747b5:
      pBVar3 = (*this->BVH4BuilderTwoLevelTriangle4iMeshSAH)(pBVar2,scene,bVar7);
      goto LAB_00c747d8;
    }
    if (bvariant != STATIC) {
      pBVar3 = (Builder *)0x0;
      goto LAB_00c747d8;
    }
LAB_00c74792:
    sVar8 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
    if (iVar1 == 0) goto LAB_00c74792;
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
    if (iVar1 == 0) goto LAB_00c7479c;
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
      if (iVar1 == 0) goto LAB_00c747ad;
      iVar1 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
      if (iVar1 != 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
        plVar6 = (long *)std::__cxx11::string::append(local_288);
        local_268 = (BVHN<4> *)*plVar6;
        pBVar2 = (BVHN<4> *)(plVar6 + 2);
        if (local_268 == pBVar2) {
          local_258 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
          aStack_250.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)plVar6[3];
          local_268 = (BVHN<4> *)&local_258;
        }
        else {
          local_258 = (pBVar2->super_AccelData).super_RefCount._vptr_RefCount;
        }
        lStack_260 = plVar6[1];
        *plVar6 = (long)pBVar2;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        *puVar5 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar5 + 1) = 2;
        puVar5[2] = puVar5 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 2),local_268,
                   (long)&(local_268->super_AccelData).super_RefCount._vptr_RefCount + lStack_260);
        __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      bVar7 = true;
      goto LAB_00c747b5;
    }
    sVar8 = 0x100;
  }
  pBVar3 = (*this->BVH4Triangle4iSceneBuilderSAH)(pBVar2,scene,sVar8);
LAB_00c747d8:
  pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar4->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar4->super_AccelData).field_0x58,&local_148,0x118);
  (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)pBVar2;
  pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar3;
  return pAVar4;
}

Assistant:

Accel* BVH4Factory::BVH4Triangle4i(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Triangle4i::type,scene);

    Accel::Intersectors intersectors;
    if      (scene->device->tri_traverser == "default") intersectors = BVH4Triangle4iIntersectors(accel,ivariant);
    else if (scene->device->tri_traverser == "fast"   ) intersectors = BVH4Triangle4iIntersectors(accel,IntersectVariant::FAST);
    else if (scene->device->tri_traverser == "robust" ) intersectors = BVH4Triangle4iIntersectors(accel,IntersectVariant::ROBUST);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown traverser "+scene->device->tri_traverser+" for BVH4<Triangle4i>");

    Builder* builder = nullptr;
    if (scene->device->tri_builder == "default"     ) {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Triangle4iSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH4BuilderTwoLevelTriangle4iMeshSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: builder = BVH4Triangle4iSceneBuilderFastSpatialSAH(accel,scene,0); break;
      }
    }
    else if (scene->device->tri_builder == "sah"         ) builder = BVH4Triangle4iSceneBuilderSAH(accel,scene,0);
    else if (scene->device->tri_builder == "sah_fast_spatial" ) builder = BVH4Triangle4iSceneBuilderFastSpatialSAH(accel,scene,0);
    else if (scene->device->tri_builder == "sah_presplit") builder = BVH4Triangle4iSceneBuilderSAH(accel,scene,MODE_HIGH_QUALITY);
    else if (scene->device->tri_builder == "dynamic"     ) builder = BVH4BuilderTwoLevelTriangle4iMeshSAH(accel,scene,false);
    else if (scene->device->tri_builder == "morton"      ) builder = BVH4BuilderTwoLevelTriangle4iMeshSAH(accel,scene,true);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder+" for BVH4<Triangle4i>");

    return new AccelInstance(accel,builder,intersectors);
  }